

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall
TimerHeap::addTimer(TimerHeap *this,int id,long timeout_ms,timeoutCallBack *callBack)

{
  unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
  *this_00;
  _Manager_type p_Var1;
  pointer psVar2;
  pointer psVar3;
  long lVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  Timer *__p;
  __weak_ptr<Timer,(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar7 [8];
  long lVar8;
  timeType_ local_88;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  long local_50;
  undefined1 local_48 [8];
  TimerPtr timer;
  int id_local;
  
  timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = id;
  if (this->timeFlag_ == false) {
    auVar7 = (undefined1  [8])(this->timeCache_).sec;
    lVar4 = (this->timeCache_).msec;
  }
  else {
    clock_gettime(1,(timespec *)local_48);
    (this->timeCache_).sec = (long)local_48;
    lVar4 = (long)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr / 1000000;
    (this->timeCache_).msec = lVar4;
    this->timeFlag_ = false;
    auVar7 = local_48;
  }
  lVar8 = (lVar4 + timeout_ms) % 1000;
  lVar4 = (long)&(((element_type *)auVar7)->timeout_).sec + (lVar4 + timeout_ms) / 1000;
  this_00 = &this->timerMap_;
  iVar5 = std::
          _Hashtable<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,
                 (key_type *)
                 ((long)&timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4));
  if (iVar5.super__Node_iterator_base<std::pair<const_int,_std::weak_ptr<Timer>_>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_50 = lVar8;
    pmVar6 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,
                          (key_type *)
                          ((long)&timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 4));
    std::__shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2> *)local_48,pmVar6);
    if ((local_48 != (undefined1  [8])0x0) && (*(int *)((long)local_48 + 0x30) != -1)) {
      ((timeType_ *)local_48)->sec = lVar4;
      ((timeType_ *)local_48)->msec = local_50;
      std::function<void_()>::operator=((timeoutCallBack *)((long)local_48 + 0x10),callBack);
      modify(this,(long)*(int *)((long)local_48 + 0x30));
      goto LAB_00125d84;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
    lVar8 = local_50;
  }
  __p = (Timer *)operator_new(0x38);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = callBack->_M_invoker;
  p_Var1 = (callBack->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callBack->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(callBack->super__Function_base)._M_functor + 8);
    (callBack->super__Function_base)._M_manager = (_Manager_type)0x0;
    callBack->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  psVar2 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (__p->timeout_).sec = lVar4;
  (__p->timeout_).msec = lVar8;
  (__p->callBack_).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(__p->callBack_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->callBack_).super__Function_base._M_functor + 8) = 0;
  (__p->callBack_)._M_invoker = p_Stack_60;
  if (p_Var1 != (_Manager_type)0x0) {
    *(void **)&(__p->callBack_).super__Function_base._M_functor = local_78._M_unused._M_object;
    *(undefined8 *)((long)&(__p->callBack_).super__Function_base._M_functor + 8) = local_78._8_8_;
    (__p->callBack_).super__Function_base._M_manager = p_Var1;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  __p->heapIndex_ = (int)((ulong)((long)psVar2 - (long)psVar3) >> 4);
  std::__shared_ptr<Timer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Timer,void>
            ((__shared_ptr<Timer,(__gnu_cxx::_Lock_policy)2> *)local_48,__p);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  this_01 = (__weak_ptr<Timer,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,
                         (key_type *)
                         ((long)&timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 4));
  std::__weak_ptr<Timer,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::push_back
            (&this->timerHeap_,(value_type *)local_48);
  upHeap(this,((long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  if ((undefined1  [8])
      (((this->timerHeap_).
        super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl
        .super__Vector_impl_data._M_start)->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == local_48) {
    local_88.sec = ((timeType_ *)local_48)->sec;
    local_88.msec = ((timeType_ *)local_48)->msec;
    setTime(this,&this->timeCache_,&local_88);
  }
LAB_00125d84:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
  return;
}

Assistant:

void TimerHeap::addTimer(int id, long timeout_ms, timeoutCallBack callBack) {
    if (timeFlag_) {
        struct timespec tv;
        clock_gettime(CLOCK_MONOTONIC, &tv);
        timeCache_.sec = tv.tv_sec;
        timeCache_.msec = tv.tv_nsec / 1000 / 1000;
        timeFlag_ = false;
    }
    Timer::timeType_ timeout(timeCache_);
    timeout.sec += (timeCache_.msec + timeout_ms) / 1000;
    timeout.msec = (timeCache_.msec + timeout_ms) % 1000;
    if (timerMap_.find(id) != timerMap_.end()) {
        TimerPtr tmp(timerMap_[id].lock());
        if (tmp && tmp->heapIndex_ != -1) {
            tmp->timeout_ = std::move(timeout);
            tmp->callBack_ = std::move(callBack);
            modify(tmp->heapIndex_);
            return;
        }
    }
    TimerPtr timer(new Timer(std::move(timeout), std::move(callBack), timerHeap_.size()));
    timerMap_[id] = timer;
    timerHeap_.push_back(timer);
    upHeap(timerHeap_.size() - 1);
    if (timerHeap_.front() == timer) { 
        setTime(timeCache_, timer->getTimeout());
    }
}